

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O1

int sfd_get_peer_gid(void *arg,void *buf,size_t *szp,nni_type t)

{
  uint in_EAX;
  int iVar1;
  undefined8 local_28;
  int ignore;
  int id;
  
  local_28 = (ulong)in_EAX;
  iVar1 = nni_posix_peerid(*(int *)((long)arg + 0x70),(int *)&local_28,(int *)((long)&local_28 + 4),
                           (int *)&local_28,(int *)&local_28);
  if (iVar1 == 0) {
    iVar1 = nni_copyout_int(local_28._4_4_,buf,szp,t);
  }
  return iVar1;
}

Assistant:

static int
sfd_get_peer_gid(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_sfd_conn *c = arg;
	int           rv;
	int           ignore;
	int           id = 0;

	rv = nni_posix_peerid(c->fd, &ignore, &id, &ignore, &ignore);
	if (rv != 0) {
		return (rv);
	}
	return (nni_copyout_int(id, buf, szp, t));
}